

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

CanonicalSet * __thiscall
parser::Parser::items
          (CanonicalSet *__return_storage_ptr__,Parser *this,Grammar *grammar,
          UniqueGrammaticSymbols *uniqueGrammaticSymbols)

{
  bool bVar1;
  pointer pCVar2;
  reference pGVar3;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  __result;
  bool local_209;
  CanonicalItem local_1b8;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_198;
  Pred local_190;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_188;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_180;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_178;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_170;
  Pred local_168;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_160;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_158;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_150;
  undefined4 local_144;
  undefined1 local_140 [8];
  Situations goToSituation;
  _Self local_120;
  iterator symbol;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_110;
  iterator canonicalItem;
  CanonicalSet t;
  int itemAdded;
  CanonicalItem local_e0;
  GrammaticSymbol local_b0;
  make_vector<parser::GrammaticSymbol> local_a8;
  vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> local_90;
  undefined1 local_78 [8];
  Situation start;
  Situations situations;
  UniqueGrammaticSymbols *uniqueGrammaticSymbols_local;
  Grammar *grammar_local;
  Parser *this_local;
  CanonicalSet *canonicalSet;
  
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::vector
            (__return_storage_ptr__);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
            ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&start.point);
  GrammaticSymbol::GrammaticSymbol(&local_b0,1,false);
  common::make_vector<parser::GrammaticSymbol>::make_vector(&local_a8,&local_b0);
  common::make_vector::operator_cast_to_vector(&local_90,(make_vector *)&local_a8);
  Situation::Situation((Situation *)local_78,0,&local_90);
  std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::~vector(&local_90)
  ;
  common::make_vector<parser::GrammaticSymbol>::~make_vector(&local_a8);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back
            ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&start.point,
             (value_type *)local_78);
  closure((Situations *)&start.point,grammar,(Situation *)local_78);
  GrammaticSymbol::GrammaticSymbol((GrammaticSymbol *)&stack0xffffffffffffff18,-1,true);
  CanonicalItem::CanonicalItem
            (&local_e0,(GrammaticSymbol *)&stack0xffffffffffffff18,(Situations *)&start.point);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::push_back
            (__return_storage_ptr__,&local_e0);
  CanonicalItem::~CanonicalItem(&local_e0);
  do {
    t.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::vector
              ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
               &canonicalItem);
    local_110._M_current =
         (CanonicalItem *)
         std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::begin
                   (__return_storage_ptr__);
    while( true ) {
      symbol._M_node =
           (_Base_ptr)
           std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                     (__return_storage_ptr__);
      bVar1 = __gnu_cxx::operator!=
                        (&local_110,
                         (__normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                          *)&symbol);
      if (!bVar1) break;
      local_120._M_node =
           (_Base_ptr)
           std::
           set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
           ::begin(uniqueGrammaticSymbols);
      while( true ) {
        goToSituation.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                      ::end(uniqueGrammaticSymbols);
        bVar1 = std::operator!=(&local_120,
                                (_Self *)&goToSituation.
                                          super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) break;
        pCVar2 = __gnu_cxx::
                 __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                 ::operator->(&local_110);
        pGVar3 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator*(&local_120);
        goTo((Situations *)local_140,this,grammar,&pCVar2->situations,pGVar3);
        bVar1 = std::vector<parser::Situation,_std::allocator<parser::Situation>_>::empty
                          ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)
                           local_140);
        if (bVar1) {
          local_144 = 9;
        }
        else {
          local_158._M_current =
               (CanonicalItem *)
               std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::begin
                         (__return_storage_ptr__);
          local_160._M_current =
               (CanonicalItem *)
               std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                         (__return_storage_ptr__);
          Pred::Pred(&local_168,(Situations *)local_140);
          local_150 = std::
                      find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,parser::Pred>
                                (local_158,local_160,local_168);
          local_170._M_current =
               (CanonicalItem *)
               std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                         (__return_storage_ptr__);
          bVar1 = __gnu_cxx::operator==(&local_150,&local_170);
          local_209 = false;
          if (bVar1) {
            local_180._M_current =
                 (CanonicalItem *)
                 std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::begin
                           ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *
                            )&canonicalItem);
            local_188._M_current =
                 (CanonicalItem *)
                 std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                           ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *
                            )&canonicalItem);
            Pred::Pred(&local_190,(Situations *)local_140);
            local_178 = std::
                        find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,parser::Pred>
                                  (local_180,local_188,local_190);
            local_198._M_current =
                 (CanonicalItem *)
                 std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                           ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *
                            )&canonicalItem);
            local_209 = __gnu_cxx::operator==(&local_178,&local_198);
          }
          if (local_209 != false) {
            pGVar3 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator*(&local_120);
            CanonicalItem::CanonicalItem(&local_1b8,pGVar3,(Situations *)local_140);
            std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::push_back
                      ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                       &canonicalItem,&local_1b8);
            CanonicalItem::~CanonicalItem(&local_1b8);
            t.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 t.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
          local_144 = 0;
        }
        std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                  ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)local_140);
        std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator++(&local_120);
      }
      __gnu_cxx::
      __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
      ::operator++(&local_110);
    }
    __first = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::begin
                        ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                         &canonicalItem);
    __last = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                       ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                        &canonicalItem);
    __result = std::
               back_inserter<std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>
                         (__return_storage_ptr__);
    std::
    copy<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,std::back_insert_iterator<std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>>
              ((__normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                )__first._M_current,
               (__normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                )__last._M_current,__result);
    std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector
              ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
               &canonicalItem);
  } while (0 < t.super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_144 = 1;
  Situation::~Situation((Situation *)local_78);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
            ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&start.point);
  return __return_storage_ptr__;
}

Assistant:

CanonicalSet items(Grammar const& grammar, UniqueGrammaticSymbols const& uniqueGrammaticSymbols) {
            CanonicalSet canonicalSet;

            Situations situations;
            Situation start(StartNonTerminal, MakeGrammaticSymbols(GrammaticSymbol(InitialNonTerminal, false)));
            situations.push_back(start);
            closure(situations, grammar, start);

            canonicalSet.push_back(CanonicalItem(GrammaticSymbol(lexer::InvalidToken), situations));

            int itemAdded;
            do {
                itemAdded = 0;
                CanonicalSet t;
                for_each(CanonicalSet, canonicalSet, canonicalItem) {
                    for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                        Situations goToSituation = goTo(grammar, canonicalItem->situations, *symbol);
                        if (goToSituation.empty())
                            continue;
                        if (std::find_if(canonicalSet.begin(), canonicalSet.end(), Pred(goToSituation)) == canonicalSet.end() &&
                            std::find_if(t.begin(), t.end(), Pred(goToSituation)) == t.end()) {
                            t.push_back(CanonicalItem(*symbol, goToSituation));
                            itemAdded++;
                        }
                    }
                }
                std::copy(t.begin(), t.end(), std::back_inserter(canonicalSet));
            } while (itemAdded > 0);

            return canonicalSet;
        }